

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleKeyFactory::getDisplayName
          (LocaleKeyFactory *this,UnicodeString *id,Locale *locale,UnicodeString *result)

{
  undefined1 local_110 [8];
  Locale loc;
  UnicodeString *result_local;
  Locale *locale_local;
  UnicodeString *id_local;
  LocaleKeyFactory *this_local;
  
  loc._216_8_ = result;
  if ((this->_coverage & 1U) == 0) {
    Locale::Locale((Locale *)local_110);
    LocaleUtility::initLocaleFromName(id,(Locale *)local_110);
    this_local = (LocaleKeyFactory *)
                 Locale::getDisplayName((Locale *)local_110,locale,(UnicodeString *)loc._216_8_);
    Locale::~Locale((Locale *)local_110);
  }
  else {
    UnicodeString::setToBogus(result);
    this_local = (LocaleKeyFactory *)loc._216_8_;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
LocaleKeyFactory::getDisplayName(const UnicodeString& id, const Locale& locale, UnicodeString& result) const {
    if ((_coverage & 0x1) == 0) {
        //UErrorCode status = U_ZERO_ERROR;
        // assume if this is called on us, we support some fallback of this id
        // if (isSupportedID(id, status)) {
            Locale loc;
            LocaleUtility::initLocaleFromName(id, loc);
            return loc.getDisplayName(locale, result);
        // }
    }
    result.setToBogus();
    return result;
}